

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void solver_finished_cb(result *r)

{
  pointer psVar1;
  char *format_str;
  long local_10;
  
  fmt::v7::print<char[17],,char>((char (*) [17])"Solver finished\n");
  switch(r->status) {
  case success:
    psVar1 = (r->solutions).
             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((r->solutions).super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
        _M_impl.super__Vector_impl_data._M_start == psVar1) {
      return;
    }
    if (psVar1[-1].variables.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        psVar1[-1].variables.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (r->loop < 0) {
        local_10 = -r->loop;
        fmt::v7::print<char[58],double_const&,long,double_const&,char>
                  ((char (*) [58])"Best solution found via push: {:.10g} in {} loop and {}s\n",
                   &psVar1[-1].value,&local_10,&r->duration);
        return;
      }
      fmt::v7::print<char[49],double_const&,long_const&,double_const&,char>
                ((char (*) [49])"Best solution found: {:.10g} in {} loop and {}s\n",
                 &psVar1[-1].value,&r->loop,&r->duration);
      return;
    }
    fmt::v7::print<char[54],double_const&,double_const&,char>
              ((char (*) [54])"Best solution found via preprocessor: {:.10g} in {}s\n",
               &psVar1[-1].value,&r->duration);
    return;
  case internal_error:
    fmt::v7::print<char[29],,char>((char (*) [29])"No solution. Internal error\n");
    return;
  case uninitialized:
    fmt::v7::print<char[34],,char>((char (*) [34])"No solution. Uninitialized error\n");
    return;
  case time_limit_reached:
    format_str = "No solution. Constraint remaining: {}. Time limit reached at {}s.\n";
    break;
  case kappa_max_reached:
    fmt::v7::print<char[62],int_const&,double_const&,char>
              ((char (*) [62])"No solution. Constraint remaining: {}. Kappa reached in {}s.\n",
               &r->remaining_constraints,&r->duration);
    return;
  case limit_reached:
    format_str = "No solution. Constraint remaining: {}. Loop limit reached in {}s.\n";
    break;
  case empty_context:
    fmt::v7::print<char[23],,char>((char (*) [23])"Context uninitialized\n");
    return;
  default:
    return;
  }
  fmt::v7::print<char[67],int_const&,double_const&,char>
            ((char (*) [67])format_str,&r->remaining_constraints,&r->duration);
  return;
}

Assistant:

static void
solver_finished_cb(const baryonyx::result& r)
{
    fmt::print("Solver finished\n");

    switch (r.status) {
    case baryonyx::result_status::success:
        if (!r.solutions.empty()) {
            if (r.solutions.back().variables.empty()) {
                fmt::print(
                  "Best solution found via preprocessor: {:.10g} in {}s\n",
                  r.solutions.back().value,
                  r.duration);
            } else {
                if (r.loop >= 0)
                    fmt::print(
                      "Best solution found: {:.10g} in {} loop and {}s\n",
                      r.solutions.back().value,
                      r.loop,
                      r.duration);
                else
                    fmt::print("Best solution found via push: {:.10g} in {} "
                               "loop and {}s\n",
                               r.solutions.back().value,
                               -r.loop,
                               r.duration);
            }
        }
        break;
    case baryonyx::result_status::internal_error:
        fmt::print("No solution. Internal error\n");
        break;
    case baryonyx::result_status::uninitialized:
        fmt::print("No solution. Uninitialized error\n");
        break;
    case baryonyx::result_status::kappa_max_reached:
        fmt::print(
          "No solution. Constraint remaining: {}. Kappa reached in {}s.\n",
          r.remaining_constraints,
          r.duration);
        break;
    case baryonyx::result_status::time_limit_reached:
        fmt::print("No solution. Constraint remaining: {}. Time limit reached "
                   "at {}s.\n",
                   r.remaining_constraints,
                   r.duration);
        break;
    case baryonyx::result_status::limit_reached:
        fmt::print("No solution. Constraint remaining: {}. Loop limit reached "
                   "in {}s.\n",
                   r.remaining_constraints,
                   r.duration);
        break;
    case baryonyx::result_status::empty_context:
        fmt::print("Context uninitialized\n");
        break;
    }
}